

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O2

void __thiscall
Disa::Adjacency_Graph<false>::insert_vertex_adjacent_list
          (Adjacency_Graph<false> *this,size_t vertex,size_t insert_vertex)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __position;
  pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  pVar1;
  size_t local_20;
  size_t local_18;
  
  local_20 = insert_vertex;
  local_18 = vertex;
  pVar1 = vertex_adjacency_iter(this,&local_18);
  __position = std::
               __lower_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (pVar1.first._M_current._M_current,pVar1.second._M_current._M_current,
                          &local_20);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::insert
            (&this->vertex_adjacent_list,(const_iterator)__position._M_current,&local_20);
  return;
}

Assistant:

void Adjacency_Graph<_directed>::insert_vertex_adjacent_list(std::size_t vertex, std::size_t insert_vertex) {
  const auto& adjacency = vertex_adjacency_iter(vertex);
  const auto& insert_iter = std::lower_bound(adjacency.first, adjacency.second, insert_vertex);
  const auto& distance = std::distance(vertex_adjacent_list.begin(), insert_iter);
  vertex_adjacent_list.insert(vertex_adjacent_list.begin() + distance, insert_vertex);
}